

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Vec3fa __thiscall
embree::CoronaLoader::load<embree::Vec3fa>(CoronaLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  long *in_RDX;
  undefined8 *in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  Vec3fa VVar5;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff57;
  Token *in_stack_ffffffffffffff58;
  string local_a0 [32];
  long *local_80;
  long *local_68;
  long *local_60;
  ParseLocation *in_stack_ffffffffffffffa8;
  
  local_80 = in_RDX;
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar1 < 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffa8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::runtime_error::runtime_error(this_00,local_a0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_80 + 0x98),0);
  fVar2 = Token::Float(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  local_60 = local_80;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_80 + 0x98),1);
  fVar3 = Token::Float(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  local_68 = local_80;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_80 + 0x98),2);
  fVar4 = Token::Float(in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff57);
  *in_RDI = CONCAT44(fVar3,fVar2);
  in_RDI[1] = (ulong)(uint)fVar4;
  VVar5.field_0.m128[2] = fVar4;
  VVar5.field_0._0_8_ = CONCAT44(fVar3,fVar2);
  VVar5.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa CoronaLoader::load<Vec3fa>(const Ref<XML>& xml) {
    if (xml->body.size() < 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }